

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restclient.cpp
# Opt level: O2

void __thiscall
YdiskRestClient::uploadFile(YdiskRestClient *this,string *path,ifstream *ifstream,BOOL overwrite)

{
  _Alloc_hider headers;
  bool bVar1;
  Json *this_00;
  runtime_error *this_01;
  long lVar2;
  char *this_02;
  sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *psVar3;
  YdiskRestClient *this_03;
  smatch m;
  string server_url;
  string url;
  shared_ptr<httplib::Response> r2;
  shared_ptr<httplib::Response> r;
  string request_url;
  regex pattern;
  undefined1 local_258 [40];
  SSLClient cli2;
  stringstream body;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198 [23];
  
  this_02 = "/v1/disk/resources/upload?path=";
  std::__cxx11::string::string((string *)&url,"/v1/disk/resources/upload?path=",(allocator *)&body);
  url_encode((string *)&body,(YdiskRestClient *)this_02,path);
  std::__cxx11::string::append((string *)&url);
  std::__cxx11::string::~string((string *)&body);
  std::__cxx11::string::append((char *)&url);
  std::__cxx11::string::append((char *)&url);
  local_258._0_8_ = (char *)0x0;
  local_258._8_8_ = (SSLClient *)0x0;
  local_258._16_8_ = 0;
  local_258._24_8_ = 0;
  httplib::Client::Get
            ((Client *)&r,(char *)this->http_client,(Headers *)url._M_dataplus._M_p,
             (Progress *)&this->headers);
  this_03 = (YdiskRestClient *)local_258;
  std::_Function_base::~_Function_base((_Function_base *)this_03);
  if ((r.super___shared_ptr<httplib::Response,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
       (element_type *)0x0) ||
     ((r.super___shared_ptr<httplib::Response,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->status != 200))
  {
    throw_response_error
              (this_03,r.super___shared_ptr<httplib::Response,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    r2.super___shared_ptr<httplib::Response,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         r.super___shared_ptr<httplib::Response,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  }
  else {
    _body = (pointer)local_198;
    local_198[0]._M_local_buf[0] = '\0';
    json11::Json::parse((Json *)&server_url,
                        &(r.super___shared_ptr<httplib::Response,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                         )->body,(string *)&body,STANDARD);
    std::__cxx11::string::string((string *)&cli2,"href",(allocator *)&request_url);
    this_00 = json11::Json::operator[]((Json *)&server_url,(string *)&cli2);
    json11::Json::string_value_abi_cxx11_(this_00);
    std::__cxx11::string::_M_assign((string *)&url);
    std::__cxx11::string::~string((string *)&cli2);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&server_url._M_string_length);
    std::__cxx11::string::~string((string *)&body);
    std::__cxx11::stringstream::stringstream((stringstream *)&body);
    std::ostream::operator<<((ostream *)local_198[0]._M_local_buf,(streambuf *)(ifstream + 0x10));
    server_url._M_dataplus._M_p = (pointer)&server_url.field_2;
    server_url._M_string_length = 0;
    server_url.field_2._M_local_buf[0] = '\0';
    request_url._M_dataplus._M_p = (pointer)&request_url.field_2;
    request_url._M_string_length = 0;
    request_url.field_2._M_local_buf[0] = '\0';
    m.
    super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    .
    super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    m._M_begin._M_current = (char *)0x0;
    m.
    super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    .
    super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    m.
    super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    .
    super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              (&pattern,"https://(.+?):443(/.+)",0x10);
    bVar1 = std::
            regex_search<std::char_traits<char>,std::allocator<char>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>>
                      (&url,&m,&pattern,0);
    if (!bVar1) goto LAB_001563c9;
    lVar2 = (long)m.
                  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  .
                  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)m.
                  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  .
                  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    if ((lVar2 == 0) || (0xfffffffffffffffd < lVar2 / 0x18 - 5U)) {
      psVar3 = (sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)((long)m.
                         super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         .
                         super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar2 + -0x48);
    }
    else {
      psVar3 = m.
               super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               .
               super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + 1;
    }
    std::__cxx11::
    sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::str((string_type *)&cli2,psVar3);
    std::__cxx11::string::operator=((string *)&server_url,(string *)&cli2);
    std::__cxx11::string::~string((string *)&cli2);
    lVar2 = (long)m.
                  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  .
                  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)m.
                  super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  .
                  super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    if ((lVar2 == 0) || (0xfffffffffffffffc < lVar2 / 0x18 - 6U)) {
      psVar3 = (sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)((long)m.
                         super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         .
                         super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar2 + -0x48);
    }
    else {
      psVar3 = m.
               super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               .
               super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + 2;
    }
    std::__cxx11::
    sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::str((string_type *)&cli2,psVar3);
    std::__cxx11::string::operator=((string *)&request_url,(string *)&cli2);
    std::__cxx11::string::~string((string *)&cli2);
    httplib::SSLClient::SSLClient(&cli2,server_url._M_dataplus._M_p,0x1bb,300);
    headers = request_url._M_dataplus;
    std::__cxx11::stringbuf::str();
    httplib::Client::Put
              ((Client *)&r2,(char *)&cli2,(Headers *)headers._M_p,(string *)&this->headers,
               &stack0xfffffffffffffd68);
    this_03 = (YdiskRestClient *)&stack0xfffffffffffffd68;
    std::__cxx11::string::~string((string *)this_03);
    if ((r2.super___shared_ptr<httplib::Response,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
         (element_type *)0x0) &&
       ((r2.super___shared_ptr<httplib::Response,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->status -
        0xc9U < 2)) {
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&r2.super___shared_ptr<httplib::Response,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      httplib::SSLClient::~SSLClient(&cli2);
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&pattern);
      std::
      _Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::~_Vector_base((_Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       *)&m);
      std::__cxx11::string::~string((string *)&request_url);
      std::__cxx11::string::~string((string *)&server_url);
      std::__cxx11::stringstream::~stringstream((stringstream *)&body);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&r.super___shared_ptr<httplib::Response,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::__cxx11::string::~string((string *)&url);
      return;
    }
  }
  throw_response_error
            (this_03,r2.super___shared_ptr<httplib::Response,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
LAB_001563c9:
  this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_01,"Error parsing file href for upload");
  __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void YdiskRestClient::uploadFile(std::string path, std::ifstream& ifstream, BOOL overwrite)
{
    std::string url("/v1/disk/resources/upload?path=");
    url += url_encode(path);
    url += "&overwrite=";
    url += (overwrite ? "true": "false");

    auto r = http_client->Get(url.c_str(), headers);
    if(r.get() && r->status==200){
        std::string error;
        const auto json = Json::parse(r->body, error);
        url = json["href"].string_value();
    } else {
        throw_response_error(r.get());
    }

    std::stringstream body;
    body << ifstream.rdbuf();

    std::string server_url, request_url;
    std::smatch m;
    auto pattern = std::regex("https://(.+?):443(/.+)");
    if (std::regex_search(url, m, pattern)) {
        server_url = m[1].str();
        request_url = m[2].str();
    } else {
        throw std::runtime_error("Error parsing file href for upload");
    }

    httplib::SSLClient cli2(server_url.c_str(), 443);
    auto r2 = cli2.Put(request_url.c_str(), headers, body.str(), "application/octet-stream");

    if(r2.get() && (r2->status==201 || r2->status==202)){
        return;
    } else {
        throw_response_error(r2.get());
    }
}